

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint __thiscall Js::FunctionBody::GetNumberOfRecursiveCallSites(FunctionBody *this)

{
  DynamicProfileInfo *pDVar1;
  uint uVar2;
  uint uVar3;
  
  pDVar1 = (this->dynamicProfileInfo).ptr;
  uVar3 = 0;
  uVar2 = 0;
  if (pDVar1 != (DynamicProfileInfo *)0x0) {
    uVar3 = pDVar1->m_recursiveInlineInfo;
    uVar2 = 0;
  }
  for (; uVar3 != 0; uVar3 = uVar3 >> 1) {
    uVar2 = uVar2 + (uVar3 & 1);
  }
  return uVar2;
}

Assistant:

uint FunctionBody::GetNumberOfRecursiveCallSites()
    {
        uint recursiveInlineSpan = 0;
        uint recursiveCallSiteInlineInfo = 0;
#if ENABLE_PROFILE_INFO
        if (this->HasDynamicProfileInfo())
        {
            recursiveCallSiteInlineInfo = this->dynamicProfileInfo->GetRecursiveInlineInfo();
        }
#endif

        while (recursiveCallSiteInlineInfo)
        {
            recursiveInlineSpan += (recursiveCallSiteInlineInfo & 1);
            recursiveCallSiteInlineInfo >>= 1;
        }
        return recursiveInlineSpan;
    }